

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

bool __thiscall
google::protobuf::DescriptorBuilder::OptionInterpreter::SetOptionValue
          (OptionInterpreter *this,FieldDescriptor *option_field,UnknownFieldSet *unknown_fields)

{
  uint uVar1;
  EnumDescriptor *this_00;
  DescriptorPool *pDVar2;
  long lVar3;
  ulong uVar4;
  double value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  bool bVar6;
  int iVar7;
  Type type;
  undefined8 *puVar8;
  UninterpretedOption *pUVar9;
  DescriptorPool *pDVar10;
  long *plVar11;
  string *psVar12;
  anon_union_8_8_13f84498_for_Symbol_2 aVar13;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar14;
  size_type *psVar15;
  int32 value_00;
  uint64 uVar16;
  OptionInterpreter *pOVar17;
  float value_01;
  double f;
  Symbol SVar18;
  string fully_qualified_name;
  string local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  string *local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  undefined1 local_50 [32];
  
  if (*(once_flag **)(option_field + 0x30) != (once_flag *)0x0) {
    local_118._M_dataplus._M_p = (pointer)FieldDescriptor::TypeOnceInit;
    local_f8._M_dataplus._M_p = (pointer)option_field;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(option_field + 0x30),(_func_void_FieldDescriptor_ptr **)&local_118,
               (FieldDescriptor **)&local_f8);
  }
  type = *(Type *)(option_field + 0x38);
  switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)type * 4)) {
  case 1:
    pUVar9 = this->uninterpreted_option_;
    uVar1 = (pUVar9->_has_bits_).has_bits_[0];
    if ((uVar1 & 8) == 0) {
      if ((uVar1 & 0x10) == 0) {
        std::operator+(&local_f8,"Value must be integer for int32 option \"",
                       *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                        (option_field + 8));
        plVar11 = (long *)std::__cxx11::string::append((char *)&local_f8);
        local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
        paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(plVar11 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar11 == paVar14) {
          local_118.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
          local_118.field_2._8_8_ = plVar11[3];
        }
        else {
          local_118.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
          local_118._M_dataplus._M_p = (pointer)*plVar11;
        }
        local_118._M_string_length = plVar11[1];
        *plVar11 = (long)paVar14;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        AddError(this->builder_,&this->options_to_interpret_->element_name,
                 &this->uninterpreted_option_->super_Message,OPTION_VALUE,&local_118);
      }
      else {
        lVar3 = pUVar9->negative_int_value_;
        if (-0x80000001 < lVar3) {
          iVar7 = *(int *)(option_field + 0x44);
          type = FieldDescriptor::type(option_field);
          value_00 = (int32)lVar3;
          pOVar17 = (OptionInterpreter *)option_field;
          goto LAB_002da844;
        }
        std::operator+(&local_f8,"Value out of range for int32 option \"",
                       *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                        (option_field + 8));
        puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_f8);
        local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
        paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar8 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar8 == paVar14) {
          local_118.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
          local_118.field_2._8_8_ = puVar8[3];
        }
        else {
          local_118.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
          local_118._M_dataplus._M_p = (pointer)*puVar8;
        }
        local_118._M_string_length = puVar8[1];
        *puVar8 = paVar14;
        puVar8[1] = 0;
        *(undefined1 *)(puVar8 + 2) = 0;
        AddError(this->builder_,&this->options_to_interpret_->element_name,
                 &this->uninterpreted_option_->super_Message,OPTION_VALUE,&local_118);
      }
    }
    else {
      uVar4 = pUVar9->positive_int_value_;
      if ((uVar4 & 0xffffffff80000000) == 0) {
        iVar7 = *(int *)(option_field + 0x44);
        pOVar17 = *(OptionInterpreter **)(option_field + 0x30);
        if (pOVar17 != (OptionInterpreter *)0x0) {
          local_118._M_dataplus._M_p = (pointer)FieldDescriptor::TypeOnceInit;
          local_f8._M_dataplus._M_p = (pointer)option_field;
          std::
          call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                    ((once_flag *)pOVar17,(_func_void_FieldDescriptor_ptr **)&local_118,
                     (FieldDescriptor **)&local_f8);
          type = *(Type *)(option_field + 0x38);
        }
        value_00 = (int32)uVar4;
LAB_002da844:
        SetInt32(pOVar17,iVar7,value_00,type,unknown_fields);
        return true;
      }
      std::operator+(&local_f8,"Value out of range for int32 option \"",
                     *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                      (option_field + 8));
      puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_f8);
      local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
      paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar8 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar8 == paVar14) {
        local_118.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
        local_118.field_2._8_8_ = puVar8[3];
      }
      else {
        local_118.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
        local_118._M_dataplus._M_p = (pointer)*puVar8;
      }
      local_118._M_string_length = puVar8[1];
      *puVar8 = paVar14;
      puVar8[1] = 0;
      *(undefined1 *)(puVar8 + 2) = 0;
      AddError(this->builder_,&this->options_to_interpret_->element_name,
               &this->uninterpreted_option_->super_Message,OPTION_VALUE,&local_118);
    }
    break;
  case 2:
    pUVar9 = this->uninterpreted_option_;
    uVar1 = (pUVar9->_has_bits_).has_bits_[0];
    if ((uVar1 & 8) == 0) {
      if ((uVar1 & 0x10) != 0) {
        iVar7 = *(int *)(option_field + 0x44);
        uVar16 = pUVar9->negative_int_value_;
LAB_002da5c9:
        pOVar17 = *(OptionInterpreter **)(option_field + 0x30);
        if (pOVar17 != (OptionInterpreter *)0x0) {
          local_118._M_dataplus._M_p = (pointer)FieldDescriptor::TypeOnceInit;
          local_f8._M_dataplus._M_p = (pointer)option_field;
          std::
          call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                    ((once_flag *)pOVar17,(_func_void_FieldDescriptor_ptr **)&local_118,
                     (FieldDescriptor **)&local_f8);
          type = *(Type *)(option_field + 0x38);
        }
        SetInt64(pOVar17,iVar7,uVar16,type,unknown_fields);
LAB_002dacae:
        return true;
      }
      std::operator+(&local_f8,"Value must be integer for int64 option \"",
                     *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                      (option_field + 8));
      puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_f8);
      local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
      paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar8 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar8 == paVar14) {
        local_118.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
        local_118.field_2._8_8_ = puVar8[3];
      }
      else {
        local_118.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
        local_118._M_dataplus._M_p = (pointer)*puVar8;
      }
      local_118._M_string_length = puVar8[1];
      *puVar8 = paVar14;
      puVar8[1] = 0;
      *(undefined1 *)(puVar8 + 2) = 0;
      AddError(this->builder_,&this->options_to_interpret_->element_name,
               &this->uninterpreted_option_->super_Message,OPTION_VALUE,&local_118);
    }
    else {
      uVar16 = pUVar9->positive_int_value_;
      if (-1 < (long)uVar16) {
        iVar7 = *(int *)(option_field + 0x44);
        goto LAB_002da5c9;
      }
      std::operator+(&local_f8,"Value out of range for int64 option \"",
                     *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                      (option_field + 8));
      puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_f8);
      local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
      paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar8 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar8 == paVar14) {
        local_118.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
        local_118.field_2._8_8_ = puVar8[3];
      }
      else {
        local_118.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
        local_118._M_dataplus._M_p = (pointer)*puVar8;
      }
      local_118._M_string_length = puVar8[1];
      *puVar8 = paVar14;
      puVar8[1] = 0;
      *(undefined1 *)(puVar8 + 2) = 0;
      AddError(this->builder_,&this->options_to_interpret_->element_name,
               &this->uninterpreted_option_->super_Message,OPTION_VALUE,&local_118);
    }
    break;
  case 3:
    if (((this->uninterpreted_option_->_has_bits_).has_bits_[0] & 8) == 0) {
      std::operator+(&local_f8,"Value must be non-negative integer for uint32 option \"",
                     *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                      (option_field + 8));
      puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_f8);
      local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
      paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar8 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar8 == paVar14) {
        local_118.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
        local_118.field_2._8_8_ = puVar8[3];
      }
      else {
        local_118.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
        local_118._M_dataplus._M_p = (pointer)*puVar8;
      }
      local_118._M_string_length = puVar8[1];
      *puVar8 = paVar14;
      puVar8[1] = 0;
      *(undefined1 *)(puVar8 + 2) = 0;
      AddError(this->builder_,&this->options_to_interpret_->element_name,
               &this->uninterpreted_option_->super_Message,OPTION_VALUE,&local_118);
    }
    else {
      uVar4 = this->uninterpreted_option_->positive_int_value_;
      if (uVar4 >> 0x20 == 0) {
        iVar7 = *(int *)(option_field + 0x44);
        pOVar17 = *(OptionInterpreter **)(option_field + 0x30);
        if (pOVar17 != (OptionInterpreter *)0x0) {
          local_118._M_dataplus._M_p = (pointer)FieldDescriptor::TypeOnceInit;
          local_f8._M_dataplus._M_p = (pointer)option_field;
          std::
          call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                    ((once_flag *)pOVar17,(_func_void_FieldDescriptor_ptr **)&local_118,
                     (FieldDescriptor **)&local_f8);
          type = *(Type *)(option_field + 0x38);
        }
        SetUInt32(pOVar17,iVar7,(uint32)uVar4,type,unknown_fields);
        return true;
      }
      std::operator+(&local_f8,"Value out of range for uint32 option \"",
                     *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                      option_field);
      puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_f8);
      local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
      paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar8 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar8 == paVar14) {
        local_118.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
        local_118.field_2._8_8_ = puVar8[3];
      }
      else {
        local_118.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
        local_118._M_dataplus._M_p = (pointer)*puVar8;
      }
      local_118._M_string_length = puVar8[1];
      *puVar8 = paVar14;
      puVar8[1] = 0;
      *(undefined1 *)(puVar8 + 2) = 0;
      AddError(this->builder_,&this->options_to_interpret_->element_name,
               &this->uninterpreted_option_->super_Message,OPTION_VALUE,&local_118);
    }
    break;
  case 4:
    if (((this->uninterpreted_option_->_has_bits_).has_bits_[0] & 8) != 0) {
      iVar7 = *(int *)(option_field + 0x44);
      uVar16 = this->uninterpreted_option_->positive_int_value_;
      pOVar17 = *(OptionInterpreter **)(option_field + 0x30);
      if (pOVar17 != (OptionInterpreter *)0x0) {
        local_118._M_dataplus._M_p = (pointer)FieldDescriptor::TypeOnceInit;
        local_f8._M_dataplus._M_p = (pointer)option_field;
        std::
        call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                  ((once_flag *)pOVar17,(_func_void_FieldDescriptor_ptr **)&local_118,
                   (FieldDescriptor **)&local_f8);
        type = *(Type *)(option_field + 0x38);
      }
      SetUInt64(pOVar17,iVar7,uVar16,type,unknown_fields);
      return true;
    }
    std::operator+(&local_f8,"Value must be non-negative integer for uint64 option \"",
                   *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                    (option_field + 8));
    puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_f8);
    local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
    paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar8 == paVar14) {
      local_118.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
      local_118.field_2._8_8_ = puVar8[3];
    }
    else {
      local_118.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
      local_118._M_dataplus._M_p = (pointer)*puVar8;
    }
    local_118._M_string_length = puVar8[1];
    *puVar8 = paVar14;
    puVar8[1] = 0;
    *(undefined1 *)(puVar8 + 2) = 0;
    AddError(this->builder_,&this->options_to_interpret_->element_name,
             &this->uninterpreted_option_->super_Message,OPTION_VALUE,&local_118);
    break;
  case 5:
    pUVar9 = this->uninterpreted_option_;
    uVar1 = (pUVar9->_has_bits_).has_bits_[0];
    if ((uVar1 & 0x20) != 0) {
      value = pUVar9->double_value_;
LAB_002da81b:
      UnknownFieldSet::AddFixed64(unknown_fields,*(int *)(option_field + 0x44),(uint64)value);
      return true;
    }
    if ((uVar1 & 8) != 0) {
      value = ((double)CONCAT44(0x45300000,(int)(pUVar9->positive_int_value_ >> 0x20)) -
              1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)pUVar9->positive_int_value_) - 4503599627370496.0);
      goto LAB_002da81b;
    }
    if ((uVar1 & 0x10) != 0) {
      value = (double)pUVar9->negative_int_value_;
      goto LAB_002da81b;
    }
    std::operator+(&local_f8,"Value must be number for double option \"",
                   *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                    (option_field + 8));
    puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_f8);
    local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
    paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar8 == paVar14) {
      local_118.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
      local_118.field_2._8_8_ = puVar8[3];
    }
    else {
      local_118.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
      local_118._M_dataplus._M_p = (pointer)*puVar8;
    }
    local_118._M_string_length = puVar8[1];
    *puVar8 = paVar14;
    puVar8[1] = 0;
    *(undefined1 *)(puVar8 + 2) = 0;
    AddError(this->builder_,&this->options_to_interpret_->element_name,
             &this->uninterpreted_option_->super_Message,OPTION_VALUE,&local_118);
    break;
  case 6:
    pUVar9 = this->uninterpreted_option_;
    uVar1 = (pUVar9->_has_bits_).has_bits_[0];
    if ((uVar1 & 0x20) != 0) {
      value_01 = (float)pUVar9->double_value_;
LAB_002da437:
      UnknownFieldSet::AddFixed32(unknown_fields,*(int *)(option_field + 0x44),(uint32)value_01);
      return true;
    }
    if ((uVar1 & 8) != 0) {
      uVar4 = pUVar9->positive_int_value_;
      if ((long)uVar4 < 0) {
        value_01 = (float)uVar4;
      }
      else {
        value_01 = (float)(long)uVar4;
      }
      goto LAB_002da437;
    }
    if ((uVar1 & 0x10) != 0) {
      value_01 = (float)pUVar9->negative_int_value_;
      goto LAB_002da437;
    }
    std::operator+(&local_f8,"Value must be number for float option \"",
                   *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                    (option_field + 8));
    puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_f8);
    local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
    paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar8 == paVar14) {
      local_118.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
      local_118.field_2._8_8_ = puVar8[3];
    }
    else {
      local_118.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
      local_118._M_dataplus._M_p = (pointer)*puVar8;
    }
    local_118._M_string_length = puVar8[1];
    *puVar8 = paVar14;
    puVar8[1] = 0;
    *(undefined1 *)(puVar8 + 2) = 0;
    AddError(this->builder_,&this->options_to_interpret_->element_name,
             &this->uninterpreted_option_->super_Message,OPTION_VALUE,&local_118);
    break;
  case 7:
    if (((this->uninterpreted_option_->_has_bits_).has_bits_[0] & 1) != 0) {
      iVar7 = std::__cxx11::string::compare
                        ((char *)(this->uninterpreted_option_->identifier_value_).ptr_);
      if (iVar7 == 0) {
        uVar16 = 1;
      }
      else {
        iVar7 = std::__cxx11::string::compare
                          ((char *)(this->uninterpreted_option_->identifier_value_).ptr_);
        if (iVar7 != 0) {
          std::operator+(&local_f8,"Value must be \"true\" or \"false\" for boolean option \"",
                         *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                          (option_field + 8));
          puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_f8);
          local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
          paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(puVar8 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar8 == paVar14) {
            local_118.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
            local_118.field_2._8_8_ = puVar8[3];
          }
          else {
            local_118.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
            local_118._M_dataplus._M_p = (pointer)*puVar8;
          }
          local_118._M_string_length = puVar8[1];
          *puVar8 = paVar14;
          puVar8[1] = 0;
          *(undefined1 *)(puVar8 + 2) = 0;
          AddError(this->builder_,&this->options_to_interpret_->element_name,
                   &this->uninterpreted_option_->super_Message,OPTION_VALUE,&local_118);
          break;
        }
        uVar16 = 0;
      }
      iVar7 = *(int *)(option_field + 0x44);
LAB_002daca4:
      UnknownFieldSet::AddVarint(unknown_fields,iVar7,uVar16);
      return true;
    }
    std::operator+(&local_f8,"Value must be identifier for boolean option \"",
                   *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                    (option_field + 8));
    puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_f8);
    local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
    paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar8 == paVar14) {
      local_118.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
      local_118.field_2._8_8_ = puVar8[3];
    }
    else {
      local_118.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
      local_118._M_dataplus._M_p = (pointer)*puVar8;
    }
    local_118._M_string_length = puVar8[1];
    *puVar8 = paVar14;
    puVar8[1] = 0;
    *(undefined1 *)(puVar8 + 2) = 0;
    AddError(this->builder_,&this->options_to_interpret_->element_name,
             &this->uninterpreted_option_->super_Message,OPTION_VALUE,&local_118);
    break;
  case 8:
    pUVar9 = this->uninterpreted_option_;
    if (((pUVar9->_has_bits_).has_bits_[0] & 1) != 0) {
      if (*(once_flag **)(option_field + 0x30) != (once_flag *)0x0) {
        local_118._M_dataplus._M_p = (pointer)option_field;
        std::
        call_once<void(&)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                  (*(once_flag **)(option_field + 0x30),FieldDescriptor::TypeOnceInit,
                   (FieldDescriptor **)&local_118);
        pUVar9 = this->uninterpreted_option_;
      }
      this_00 = *(EnumDescriptor **)(option_field + 0x70);
      local_d8 = (pUVar9->identifier_value_).ptr_;
      pDVar2 = *(DescriptorPool **)(*(long *)(this_00 + 0x10) + 0x10);
      pDVar10 = DescriptorPool::internal_generated_pool();
      internal::AssignDescriptors((DescriptorTable *)0x2da2d0);
      psVar12 = local_d8;
      if (pDVar2 == pDVar10) {
        aVar13.enum_value_descriptor = EnumDescriptor::FindValueByName(this_00,local_d8);
      }
      else {
        local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
        lVar3 = **(long **)(this_00 + 8);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_118,lVar3,(*(long **)(this_00 + 8))[1] + lVar3);
        std::__cxx11::string::resize
                  ((ulong)&local_118,
                   (char)local_118._M_string_length - (char)*(undefined8 *)(*(long *)this_00 + 8));
        std::__cxx11::string::_M_append((char *)&local_118,(ulong)(local_d8->_M_dataplus)._M_p);
        SVar18 = FindSymbolNotEnforcingDeps(this->builder_,&local_118,true);
        aVar13 = SVar18.field_1;
        bVar6 = true;
        if (SVar18.type == ENUM_VALUE) {
          if (*(EnumDescriptor **)(aVar13.descriptor + 0x18) != this_00) {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_50,"Enum type \"",
                           *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                            (this_00 + 8));
            plVar11 = (long *)std::__cxx11::string::append(local_50);
            psVar15 = (size_type *)(plVar11 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar11 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar15) {
              local_70.field_2._M_allocated_capacity = *psVar15;
              local_70.field_2._8_8_ = plVar11[3];
              local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
            }
            else {
              local_70.field_2._M_allocated_capacity = *psVar15;
              local_70._M_dataplus._M_p = (pointer)*plVar11;
            }
            local_70._M_string_length = plVar11[1];
            *plVar11 = (long)psVar15;
            plVar11[1] = 0;
            *(undefined1 *)(plVar11 + 2) = 0;
            std::operator+(&local_d0,&local_70,local_d8);
            plVar11 = (long *)std::__cxx11::string::append((char *)&local_d0);
            psVar15 = (size_type *)(plVar11 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar11 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar15) {
              local_b0.field_2._M_allocated_capacity = *psVar15;
              local_b0.field_2._8_8_ = plVar11[3];
              local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
            }
            else {
              local_b0.field_2._M_allocated_capacity = *psVar15;
              local_b0._M_dataplus._M_p = (pointer)*plVar11;
            }
            local_b0._M_string_length = plVar11[1];
            *plVar11 = (long)psVar15;
            plVar11[1] = 0;
            *(undefined1 *)(plVar11 + 2) = 0;
            std::operator+(&local_90,&local_b0,
                           *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                            (option_field + 8));
            plVar11 = (long *)std::__cxx11::string::append((char *)&local_90);
            paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(plVar11 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar11 == paVar14) {
              local_f8.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
              local_f8.field_2._8_8_ = plVar11[3];
              local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
            }
            else {
              local_f8.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
              local_f8._M_dataplus._M_p = (pointer)*plVar11;
            }
            local_f8._M_string_length = plVar11[1];
            *plVar11 = (long)paVar14;
            plVar11[1] = 0;
            *(undefined1 *)(plVar11 + 2) = 0;
            AddError(this->builder_,&this->options_to_interpret_->element_name,
                     &this->uninterpreted_option_->super_Message,OPTION_VALUE,&local_f8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
              operator_delete(local_f8._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_90._M_dataplus._M_p != &local_90.field_2) {
              operator_delete(local_90._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
              operator_delete(local_b0._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
              operator_delete(local_d0._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_70._M_dataplus._M_p != &local_70.field_2) {
              operator_delete(local_70._M_dataplus._M_p);
            }
            if ((FieldDescriptor *)local_50._0_8_ != (FieldDescriptor *)(local_50 + 0x10)) {
              operator_delete((void *)local_50._0_8_);
            }
            bVar6 = false;
            aVar13.descriptor = (Descriptor *)0x0;
          }
        }
        else {
          aVar13.descriptor = (Descriptor *)0x0;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118._M_dataplus._M_p != &local_118.field_2) {
          operator_delete(local_118._M_dataplus._M_p);
        }
        psVar12 = local_d8;
        if (!bVar6) {
          return false;
        }
      }
      if (aVar13.descriptor != (Descriptor *)0x0) {
        iVar7 = *(int *)(option_field + 0x44);
        uVar16 = (uint64)*(int *)(aVar13.descriptor + 0x10);
        goto LAB_002daca4;
      }
      if (*(once_flag **)(option_field + 0x30) != (once_flag *)0x0) {
        local_50._0_8_ = option_field;
        std::
        call_once<void(&)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                  (*(once_flag **)(option_field + 0x30),FieldDescriptor::TypeOnceInit,
                   (FieldDescriptor **)local_50);
      }
      std::operator+(&local_70,"Enum type \"",
                     *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                      (*(long *)(option_field + 0x70) + 8));
      plVar11 = (long *)std::__cxx11::string::append((char *)&local_70);
      psVar15 = (size_type *)(plVar11 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar11 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar15) {
        local_d0.field_2._M_allocated_capacity = *psVar15;
        local_d0.field_2._8_8_ = plVar11[3];
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      }
      else {
        local_d0.field_2._M_allocated_capacity = *psVar15;
        local_d0._M_dataplus._M_p = (pointer)*plVar11;
      }
      local_d0._M_string_length = plVar11[1];
      *plVar11 = (long)psVar15;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      std::operator+(&local_b0,&local_d0,psVar12);
      plVar11 = (long *)std::__cxx11::string::append((char *)&local_b0);
      psVar15 = (size_type *)(plVar11 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar11 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar15) {
        local_90.field_2._M_allocated_capacity = *psVar15;
        local_90.field_2._8_8_ = plVar11[3];
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      }
      else {
        local_90.field_2._M_allocated_capacity = *psVar15;
        local_90._M_dataplus._M_p = (pointer)*plVar11;
      }
      local_90._M_string_length = plVar11[1];
      *plVar11 = (long)psVar15;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      std::operator+(&local_f8,&local_90,
                     *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                      (option_field + 8));
      puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_f8);
      paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar8 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar8 == paVar14) {
        local_118.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
        local_118.field_2._8_8_ = puVar8[3];
        local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
      }
      else {
        local_118.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
        local_118._M_dataplus._M_p = (pointer)*puVar8;
      }
      local_118._M_string_length = puVar8[1];
      *puVar8 = paVar14;
      puVar8[1] = 0;
      *(undefined1 *)(puVar8 + 2) = 0;
      AddError(this->builder_,&this->options_to_interpret_->element_name,
               &this->uninterpreted_option_->super_Message,OPTION_VALUE,&local_118);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != &local_118.field_2) {
        operator_delete(local_118._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        operator_delete(local_f8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p);
      }
      pbVar5 = &local_70;
      goto LAB_002daad2;
    }
    std::operator+(&local_f8,"Value must be identifier for enum-valued option \"",
                   *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                    (option_field + 8));
    puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_f8);
    local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
    paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar8 == paVar14) {
      local_118.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
      local_118.field_2._8_8_ = puVar8[3];
    }
    else {
      local_118.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
      local_118._M_dataplus._M_p = (pointer)*puVar8;
    }
    local_118._M_string_length = puVar8[1];
    *puVar8 = paVar14;
    puVar8[1] = 0;
    *(undefined1 *)(puVar8 + 2) = 0;
    AddError(this->builder_,&this->options_to_interpret_->element_name,
             &this->uninterpreted_option_->super_Message,OPTION_VALUE,&local_118);
    break;
  case 9:
    if (((this->uninterpreted_option_->_has_bits_).has_bits_[0] & 2) != 0) {
      psVar12 = UnknownFieldSet::AddLengthDelimited_abi_cxx11_
                          (unknown_fields,*(int *)(option_field + 0x44));
      std::__cxx11::string::_M_assign((string *)psVar12);
      return true;
    }
    std::operator+(&local_f8,"Value must be quoted string for string option \"",
                   *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                    (option_field + 8));
    puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_f8);
    local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
    paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar8 == paVar14) {
      local_118.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
      local_118.field_2._8_8_ = puVar8[3];
    }
    else {
      local_118.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
      local_118._M_dataplus._M_p = (pointer)*puVar8;
    }
    local_118._M_string_length = puVar8[1];
    *puVar8 = paVar14;
    puVar8[1] = 0;
    *(undefined1 *)(puVar8 + 2) = 0;
    AddError(this->builder_,&this->options_to_interpret_->element_name,
             &this->uninterpreted_option_->super_Message,OPTION_VALUE,&local_118);
    break;
  case 10:
    bVar6 = SetAggregateOption(this,option_field,unknown_fields);
    if (!bVar6) {
      return false;
    }
    return true;
  default:
    goto LAB_002dacae;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p);
  }
  pbVar5 = &local_f8;
LAB_002daad2:
  paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(&(pbVar5->field_2)._M_allocated_capacity)[-2];
  if (paVar14 != &pbVar5->field_2) {
    operator_delete(paVar14);
  }
  return false;
}

Assistant:

bool DescriptorBuilder::OptionInterpreter::SetOptionValue(
    const FieldDescriptor* option_field, UnknownFieldSet* unknown_fields) {
  // We switch on the CppType to validate.
  switch (option_field->cpp_type()) {
    case FieldDescriptor::CPPTYPE_INT32:
      if (uninterpreted_option_->has_positive_int_value()) {
        if (uninterpreted_option_->positive_int_value() >
            static_cast<uint64>(kint32max)) {
          return AddValueError("Value out of range for int32 option \"" +
                               option_field->full_name() + "\".");
        } else {
          SetInt32(option_field->number(),
                   uninterpreted_option_->positive_int_value(),
                   option_field->type(), unknown_fields);
        }
      } else if (uninterpreted_option_->has_negative_int_value()) {
        if (uninterpreted_option_->negative_int_value() <
            static_cast<int64>(kint32min)) {
          return AddValueError("Value out of range for int32 option \"" +
                               option_field->full_name() + "\".");
        } else {
          SetInt32(option_field->number(),
                   uninterpreted_option_->negative_int_value(),
                   option_field->type(), unknown_fields);
        }
      } else {
        return AddValueError("Value must be integer for int32 option \"" +
                             option_field->full_name() + "\".");
      }
      break;

    case FieldDescriptor::CPPTYPE_INT64:
      if (uninterpreted_option_->has_positive_int_value()) {
        if (uninterpreted_option_->positive_int_value() >
            static_cast<uint64>(kint64max)) {
          return AddValueError("Value out of range for int64 option \"" +
                               option_field->full_name() + "\".");
        } else {
          SetInt64(option_field->number(),
                   uninterpreted_option_->positive_int_value(),
                   option_field->type(), unknown_fields);
        }
      } else if (uninterpreted_option_->has_negative_int_value()) {
        SetInt64(option_field->number(),
                 uninterpreted_option_->negative_int_value(),
                 option_field->type(), unknown_fields);
      } else {
        return AddValueError("Value must be integer for int64 option \"" +
                             option_field->full_name() + "\".");
      }
      break;

    case FieldDescriptor::CPPTYPE_UINT32:
      if (uninterpreted_option_->has_positive_int_value()) {
        if (uninterpreted_option_->positive_int_value() > kuint32max) {
          return AddValueError("Value out of range for uint32 option \"" +
                               option_field->name() + "\".");
        } else {
          SetUInt32(option_field->number(),
                    uninterpreted_option_->positive_int_value(),
                    option_field->type(), unknown_fields);
        }
      } else {
        return AddValueError(
            "Value must be non-negative integer for uint32 "
            "option \"" +
            option_field->full_name() + "\".");
      }
      break;

    case FieldDescriptor::CPPTYPE_UINT64:
      if (uninterpreted_option_->has_positive_int_value()) {
        SetUInt64(option_field->number(),
                  uninterpreted_option_->positive_int_value(),
                  option_field->type(), unknown_fields);
      } else {
        return AddValueError(
            "Value must be non-negative integer for uint64 "
            "option \"" +
            option_field->full_name() + "\".");
      }
      break;

    case FieldDescriptor::CPPTYPE_FLOAT: {
      float value;
      if (uninterpreted_option_->has_double_value()) {
        value = uninterpreted_option_->double_value();
      } else if (uninterpreted_option_->has_positive_int_value()) {
        value = uninterpreted_option_->positive_int_value();
      } else if (uninterpreted_option_->has_negative_int_value()) {
        value = uninterpreted_option_->negative_int_value();
      } else {
        return AddValueError("Value must be number for float option \"" +
                             option_field->full_name() + "\".");
      }
      unknown_fields->AddFixed32(option_field->number(),
                                 internal::WireFormatLite::EncodeFloat(value));
      break;
    }

    case FieldDescriptor::CPPTYPE_DOUBLE: {
      double value;
      if (uninterpreted_option_->has_double_value()) {
        value = uninterpreted_option_->double_value();
      } else if (uninterpreted_option_->has_positive_int_value()) {
        value = uninterpreted_option_->positive_int_value();
      } else if (uninterpreted_option_->has_negative_int_value()) {
        value = uninterpreted_option_->negative_int_value();
      } else {
        return AddValueError("Value must be number for double option \"" +
                             option_field->full_name() + "\".");
      }
      unknown_fields->AddFixed64(option_field->number(),
                                 internal::WireFormatLite::EncodeDouble(value));
      break;
    }

    case FieldDescriptor::CPPTYPE_BOOL:
      uint64 value;
      if (!uninterpreted_option_->has_identifier_value()) {
        return AddValueError(
            "Value must be identifier for boolean option "
            "\"" +
            option_field->full_name() + "\".");
      }
      if (uninterpreted_option_->identifier_value() == "true") {
        value = 1;
      } else if (uninterpreted_option_->identifier_value() == "false") {
        value = 0;
      } else {
        return AddValueError(
            "Value must be \"true\" or \"false\" for boolean "
            "option \"" +
            option_field->full_name() + "\".");
      }
      unknown_fields->AddVarint(option_field->number(), value);
      break;

    case FieldDescriptor::CPPTYPE_ENUM: {
      if (!uninterpreted_option_->has_identifier_value()) {
        return AddValueError(
            "Value must be identifier for enum-valued option "
            "\"" +
            option_field->full_name() + "\".");
      }
      const EnumDescriptor* enum_type = option_field->enum_type();
      const std::string& value_name = uninterpreted_option_->identifier_value();
      const EnumValueDescriptor* enum_value = nullptr;

      if (enum_type->file()->pool() != DescriptorPool::generated_pool()) {
        // Note that the enum value's fully-qualified name is a sibling of the
        // enum's name, not a child of it.
        std::string fully_qualified_name = enum_type->full_name();
        fully_qualified_name.resize(fully_qualified_name.size() -
                                    enum_type->name().size());
        fully_qualified_name += value_name;

        // Search for the enum value's descriptor in the builder's pool. Note
        // that we use DescriptorBuilder::FindSymbolNotEnforcingDeps(), not
        // DescriptorPool::FindEnumValueByName() because we're already holding
        // the pool's mutex, and the latter method locks it again.
        Symbol symbol =
            builder_->FindSymbolNotEnforcingDeps(fully_qualified_name);
        if (!symbol.IsNull() && symbol.type == Symbol::ENUM_VALUE) {
          if (symbol.enum_value_descriptor->type() != enum_type) {
            return AddValueError(
                "Enum type \"" + enum_type->full_name() +
                "\" has no value named \"" + value_name + "\" for option \"" +
                option_field->full_name() +
                "\". This appears to be a value from a sibling type.");
          } else {
            enum_value = symbol.enum_value_descriptor;
          }
        }
      } else {
        // The enum type is in the generated pool, so we can search for the
        // value there.
        enum_value = enum_type->FindValueByName(value_name);
      }

      if (enum_value == nullptr) {
        return AddValueError("Enum type \"" +
                             option_field->enum_type()->full_name() +
                             "\" has no value named \"" + value_name +
                             "\" for "
                             "option \"" +
                             option_field->full_name() + "\".");
      } else {
        // Sign-extension is not a problem, since we cast directly from int32 to
        // uint64, without first going through uint32.
        unknown_fields->AddVarint(
            option_field->number(),
            static_cast<uint64>(static_cast<int64>(enum_value->number())));
      }
      break;
    }

    case FieldDescriptor::CPPTYPE_STRING:
      if (!uninterpreted_option_->has_string_value()) {
        return AddValueError(
            "Value must be quoted string for string option "
            "\"" +
            option_field->full_name() + "\".");
      }
      // The string has already been unquoted and unescaped by the parser.
      unknown_fields->AddLengthDelimited(option_field->number(),
                                         uninterpreted_option_->string_value());
      break;

    case FieldDescriptor::CPPTYPE_MESSAGE:
      if (!SetAggregateOption(option_field, unknown_fields)) {
        return false;
      }
      break;
  }

  return true;
}